

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermConstantUnion * __thiscall
glslang::TIntermediate::addConstantUnion(TIntermediate *this,char i8,TSourceLoc *loc,bool literal)

{
  TConstUnion *this_00;
  TIntermConstantUnion *pTVar1;
  TType local_d0;
  undefined1 local_38 [8];
  TConstUnionArray unionArray;
  bool literal_local;
  TSourceLoc *loc_local;
  char i8_local;
  TIntermediate *this_local;
  
  unionArray.unionArray._7_1_ = literal;
  TConstUnionArray::TConstUnionArray((TConstUnionArray *)local_38,1);
  this_00 = TConstUnionArray::operator[]((TConstUnionArray *)local_38,0);
  TConstUnion::setI8Const(this_00,i8);
  TType::TType(&local_d0,EbtInt8,EvqConst,1,0,0,false);
  pTVar1 = addConstantUnion(this,(TConstUnionArray *)local_38,&local_d0,loc,
                            (bool)(unionArray.unionArray._7_1_ & 1));
  TType::~TType(&local_d0);
  TConstUnionArray::~TConstUnionArray((TConstUnionArray *)local_38);
  return pTVar1;
}

Assistant:

TIntermConstantUnion* TIntermediate::addConstantUnion(signed char i8, const TSourceLoc& loc, bool literal) const
{
    TConstUnionArray unionArray(1);
    unionArray[0].setI8Const(i8);

    return addConstantUnion(unionArray, TType(EbtInt8, EvqConst), loc, literal);
}